

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityDamageStatusPdu.cpp
# Opt level: O1

int __thiscall DIS::EntityDamageStatusPdu::getMarshalledSize(EntityDamageStatusPdu *this)

{
  int iVar1;
  int iVar2;
  pointer pDVar3;
  long lVar4;
  ulong uVar5;
  DirectedEnergyDamage listElement;
  DirectedEnergyDamage local_90;
  
  iVar1 = WarfareFamilyPdu::getMarshalledSize(&this->super_WarfareFamilyPdu);
  iVar2 = EntityID::getMarshalledSize(&this->_damagedEntityID);
  iVar1 = iVar1 + iVar2 + 6;
  pDVar3 = (this->_damageDescriptionRecords).
           super__Vector_base<DIS::DirectedEnergyDamage,_std::allocator<DIS::DirectedEnergyDamage>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_damageDescriptionRecords).
      super__Vector_base<DIS::DirectedEnergyDamage,_std::allocator<DIS::DirectedEnergyDamage>_>.
      _M_impl.super__Vector_impl_data._M_finish != pDVar3) {
    lVar4 = 0x58;
    uVar5 = 0;
    do {
      local_90._vptr_DirectedEnergyDamage = (_func_int **)&PTR__DirectedEnergyDamage_001b4158;
      local_90._8_8_ = *(undefined8 *)((long)pDVar3 + lVar4 + -0x50);
      local_90._damageLocation._vptr_Vector3Float = (_func_int **)&PTR__Vector3Float_001b6790;
      local_90._damageLocation._z = *(float *)((long)pDVar3 + lVar4 + -0x38);
      local_90._damageLocation._8_8_ = *(undefined8 *)((long)pDVar3 + lVar4 + -0x40);
      local_90._48_4_ = *(undefined4 *)((long)pDVar3 + lVar4 + -0x28);
      local_90._40_8_ = *(undefined8 *)((long)pDVar3 + lVar4 + -0x30);
      local_90._fireEventID._vptr_EventIdentifier = (_func_int **)&PTR__EventIdentifier_001b4930;
      local_90._fireEventID._simulationAddress._vptr_SimulationAddress =
           (_func_int **)&PTR__SimulationAddress_001b5fb8;
      local_90._fireEventID._simulationAddress._8_4_ = *(undefined4 *)((long)pDVar3 + lVar4 + -0x10)
      ;
      local_90._fireEventID._eventNumber = *(unsigned_short *)((long)pDVar3 + lVar4 + -8);
      local_90._padding2 = *(unsigned_short *)((long)&pDVar3->_vptr_DirectedEnergyDamage + lVar4);
      iVar2 = DirectedEnergyDamage::getMarshalledSize(&local_90);
      iVar1 = iVar1 + iVar2;
      DirectedEnergyDamage::~DirectedEnergyDamage(&local_90);
      uVar5 = uVar5 + 1;
      pDVar3 = (this->_damageDescriptionRecords).
               super__Vector_base<DIS::DirectedEnergyDamage,_std::allocator<DIS::DirectedEnergyDamage>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x60;
    } while (uVar5 < (ulong)(((long)(this->_damageDescriptionRecords).
                                    super__Vector_base<DIS::DirectedEnergyDamage,_std::allocator<DIS::DirectedEnergyDamage>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar3 >> 5)
                            * -0x5555555555555555));
  }
  return iVar1;
}

Assistant:

int EntityDamageStatusPdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = WarfareFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _damagedEntityID.getMarshalledSize();  // _damagedEntityID
   marshalSize = marshalSize + 2;  // _padding1
   marshalSize = marshalSize + 2;  // _padding2
   marshalSize = marshalSize + 2;  // _numberOfDamageDescription

   for(unsigned long long idx=0; idx < _damageDescriptionRecords.size(); idx++)
   {
        DirectedEnergyDamage listElement = _damageDescriptionRecords[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}